

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetExecutableNames
          (cmGeneratorTarget *this,string *name,string *realName,string *impName,string *pdbName,
          string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  char *pcVar4;
  bool local_1d1;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string suffix;
  string base;
  string prefix;
  string local_c0;
  allocator local_99;
  string local_98;
  char *local_78;
  char *version;
  allocator local_59;
  undefined1 local_58 [8];
  string msg;
  string *config_local;
  string *pdbName_local;
  string *impName_local;
  string *realName_local;
  string *name_local;
  cmGeneratorTarget *this_local;
  
  msg.field_2._8_8_ = config;
  bVar1 = IsImported(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_58,"GetExecutableNames called on imported target: ",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    psVar3 = GetName_abi_cxx11_(this);
    std::__cxx11::string::operator+=((string *)local_58,(string *)psVar3);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"VERSION",&local_99);
  pcVar4 = GetProperty(this,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_78 = pcVar4;
  TVar2 = GetType(this);
  prefix.field_2._M_local_buf[0xe] = '\0';
  prefix.field_2._M_local_buf[0xd] = '\0';
  local_1d1 = true;
  if (TVar2 == EXECUTABLE) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    prefix.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string
              ((string *)&local_c0,"XCODE",(allocator *)(prefix.field_2._M_local_buf + 0xf));
    prefix.field_2._M_local_buf[0xd] = '\x01';
    local_1d1 = cmMakefile::IsOn(this_00,&local_c0);
  }
  if ((prefix.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if ((prefix.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
  }
  if (local_1d1 != false) {
    local_78 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)(base.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_128);
  GetFullNameInternal(this,(string *)msg.field_2._8_8_,false,
                      (string *)(base.field_2._M_local_buf + 8),
                      (string *)(suffix.field_2._M_local_buf + 8),(string *)local_128);
  std::operator+(&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&base.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8));
  std::operator+(&local_148,&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  std::__cxx11::string::operator=((string *)name,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::operator=((string *)realName,(string *)name);
  if (local_78 != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)realName,"-");
    std::__cxx11::string::operator+=((string *)realName,local_78);
  }
  GetFullNameInternal(&local_188,this,(string *)msg.field_2._8_8_,true);
  std::__cxx11::string::operator=((string *)impName,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  GetPDBName(&local_1a8,this,(string *)msg.field_2._8_8_);
  std::__cxx11::string::operator=((string *)pdbName,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGeneratorTarget::GetExecutableNames(std::string& name,
                                  std::string& realName,
                                  std::string& impName,
                                  std::string& pdbName,
                                  const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if(this->IsImported())
    {
    std::string msg =
      "GetExecutableNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(cmake::INTERNAL_ERROR, msg);
    }

  // This versioning is supported only for executables and then only
  // when the platform supports symbolic links.
#if defined(_WIN32) && !defined(__CYGWIN__)
  const char* version = 0;
#else
  // Check for executable version properties.
  const char* version = this->GetProperty("VERSION");
  if(this->GetType() != cmState::EXECUTABLE || this->Makefile->IsOn("XCODE"))
    {
    version = 0;
    }
#endif

  // Get the components of the executable name.
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, false, prefix, base, suffix);

  // The executable name.
  name = prefix+base+suffix;

  // The executable's real name on disk.
#if defined(__CYGWIN__)
  realName = prefix+base;
#else
  realName = name;
#endif
  if(version)
    {
    realName += "-";
    realName += version;
    }
#if defined(__CYGWIN__)
  realName += suffix;
#endif

  // The import library name.
  impName = this->GetFullNameInternal(config, true);

  // The program database file name.
  pdbName = this->GetPDBName(config);
}